

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BondOrderParameter.cpp
# Opt level: O0

void __thiscall OpenMD::BondOrderParameter::process(BondOrderParameter *this)

{
  int iVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  SnapshotManager *this_00;
  Snapshot *pSVar5;
  mapped_type *pmVar6;
  double *pdVar7;
  reference pvVar8;
  reference pvVar9;
  mapped_type *pmVar10;
  mapped_type *pmVar11;
  long *in_RDI;
  double extraout_XMM0_Qa;
  double dVar12;
  double extraout_XMM0_Qa_00;
  double extraout_XMM0_Qa_01;
  double extraout_XMM0_Qa_02;
  SelectionEvaluator *extraout_XMM0_Qa_03;
  map<std::pair<int,_int>,_std::complex<double>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::complex<double>_>_>_>
  *extraout_XMM0_Qa_04;
  SelectionManager *extraout_XMM0_Qa_05;
  double in_XMM1_Qa;
  undefined8 uVar13;
  SelectionEvaluator *__k;
  int m3_1;
  int m2_1;
  int mmm_1;
  pair<int,_int> lm_1;
  int m1_1;
  int l_7;
  int m_5;
  int l_6;
  int m_4;
  int l_5;
  int m_3;
  int l_4;
  int m3;
  int m2;
  int mmm;
  pair<int,_int> lm;
  int m1;
  int l_3;
  int m_2;
  int l_2;
  int m_1;
  int l_1;
  int m;
  int l;
  int istep;
  int nFrames;
  DumpReader reader;
  bool usePeriodicBoundaryConditions_;
  int i;
  SphericalHarmonic sphericalHarmonic;
  int Nbonds;
  int nBonds;
  vector<std::complex<double>,_std::allocator<std::complex<double>_>_> W_hat;
  vector<std::complex<double>,_std::allocator<std::complex<double>_>_> W;
  vector<double,_std::allocator<double>_> Q;
  vector<double,_std::allocator<double>_> Q2;
  map<std::pair<int,_int>,_std::complex<double>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::complex<double>_>_>_>
  QBar;
  vector<std::complex<double>,_std::allocator<std::complex<double>_>_> w_hat;
  vector<std::complex<double>,_std::allocator<std::complex<double>_>_> w;
  vector<double,_std::allocator<double>_> q2;
  vector<double,_std::allocator<double>_> q_l;
  map<std::pair<int,_int>,_std::complex<double>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::complex<double>_>_>_>
  q;
  RealType r;
  RealType phi;
  RealType costheta;
  Vector3d vec;
  StuntDouble *sd;
  AtomIterator ai;
  MoleculeIterator mi;
  int myIndex;
  Atom *atom;
  Molecule *mol;
  complex<double> *in_stack_ffffffffffffe6c8;
  DumpReader *in_stack_ffffffffffffe6d0;
  StuntDouble *in_stack_ffffffffffffe6d8;
  SelectionManager *in_stack_ffffffffffffe6e0;
  iterator *in_stack_ffffffffffffe6e8;
  SimInfo *in_stack_ffffffffffffe6f0;
  SelectionEvaluator *in_stack_ffffffffffffe708;
  map<std::pair<int,_int>,_std::complex<double>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::complex<double>_>_>_>
  *in_stack_ffffffffffffe710;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffe718;
  pair<int,_int> in_stack_ffffffffffffe720;
  RealType in_stack_ffffffffffffe728;
  SphericalHarmonic *in_stack_ffffffffffffe730;
  Vector3d *in_stack_ffffffffffffe748;
  Snapshot *in_stack_ffffffffffffe750;
  int in_stack_ffffffffffffe75c;
  mapped_type mVar14;
  DumpReader *in_stack_ffffffffffffe760;
  string *in_stack_ffffffffffffe920;
  SimInfo *in_stack_ffffffffffffe928;
  undefined4 in_stack_ffffffffffffe930;
  undefined4 in_stack_ffffffffffffe934;
  int local_15cc;
  int local_15c0;
  int local_15bc;
  int local_15b0;
  int local_15ac;
  int local_15a0;
  int local_159c;
  int local_1570;
  int local_156c;
  undefined1 local_1568 [24];
  undefined1 local_1550 [24];
  double local_1538;
  double local_1530;
  undefined8 local_1528;
  pair<int,_int> local_1520;
  pair<int,_int> local_1518;
  double local_1508;
  int local_14dc;
  int local_14d8;
  int local_14d4;
  pair<int,_int> local_14d0;
  int local_14c8;
  int local_14c4;
  pair<int,_int> local_14c0;
  pair<int,_int> local_14b8;
  int local_14b0;
  int local_14ac;
  pair<int,_int> local_14a8;
  double local_1498;
  int local_1490;
  int local_148c;
  pair<int,_int> local_1440;
  int local_1438;
  int local_1434;
  int local_1418;
  int local_1414;
  vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *in_stack_ffffffffffffede0;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffede8;
  BondOrderParameter *in_stack_ffffffffffffedf0;
  SphericalHarmonic local_1a0;
  int local_190;
  int local_18c;
  vector<std::complex<double>,_std::allocator<std::complex<double>_>_> local_188;
  vector<std::complex<double>,_std::allocator<std::complex<double>_>_> local_170;
  vector<double,_std::allocator<double>_> local_158;
  vector<double,_std::allocator<double>_> local_140 [3];
  vector<std::complex<double>,_std::allocator<std::complex<double>_>_> local_f8;
  vector<std::complex<double>,_std::allocator<std::complex<double>_>_> local_e0;
  vector<double,_std::allocator<double>_> local_c8;
  vector<double,_std::allocator<double>_> local_b0 [3];
  double local_68;
  double local_60;
  double local_58;
  Vector3<double> local_50;
  StuntDouble *local_38;
  __normal_iterator<OpenMD::Atom_**,_std::vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>_>
  local_30;
  _Rb_tree_iterator<std::pair<const_int,_OpenMD::Molecule_*>_> local_28;
  int local_1c;
  Atom *local_18;
  Molecule *local_10;
  
  std::_Rb_tree_iterator<std::pair<const_int,_OpenMD::Molecule_*>_>::_Rb_tree_iterator(&local_28);
  __gnu_cxx::
  __normal_iterator<OpenMD::Atom_**,_std::vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>_>
  ::__normal_iterator(&local_30);
  Vector3<double>::Vector3((Vector3<double> *)0x13ce26);
  std::
  map<std::pair<int,_int>,_std::complex<double>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::complex<double>_>_>_>
  ::map((map<std::pair<int,_int>,_std::complex<double>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::complex<double>_>_>_>
         *)0x13ce33);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x13ce40);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x13ce4d);
  std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::vector
            ((vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)0x13ce5a);
  std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::vector
            ((vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)0x13ce67);
  std::
  map<std::pair<int,_int>,_std::complex<double>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::complex<double>_>_>_>
  ::map((map<std::pair<int,_int>,_std::complex<double>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::complex<double>_>_>_>
         *)0x13ce74);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x13ce81);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x13ce8e);
  std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::vector
            ((vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)0x13ce9b);
  std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::vector
            ((vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)0x13cea8);
  SphericalHarmonic::SphericalHarmonic(&local_1a0);
  SimInfo::getSimParams((SimInfo *)in_RDI[1]);
  bVar2 = Globals::getUsePeriodicBoundaryConditions((Globals *)0x13cedf);
  DumpReader::DumpReader
            ((DumpReader *)CONCAT44(in_stack_ffffffffffffe934,in_stack_ffffffffffffe930),
             in_stack_ffffffffffffe928,in_stack_ffffffffffffe920);
  local_1414 = DumpReader::getNFrames(in_stack_ffffffffffffe6d0);
  *(undefined4 *)(in_RDI + 0xe2) = 0;
  std::vector<double,_std::allocator<double>_>::resize
            ((vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffe6f0,
             (size_type)in_stack_ffffffffffffe6e8);
  std::vector<double,_std::allocator<double>_>::resize
            ((vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffe6f0,
             (size_type)in_stack_ffffffffffffe6e8);
  std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::resize
            ((vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)
             in_stack_ffffffffffffe6f0,(size_type)in_stack_ffffffffffffe6e8);
  std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::resize
            ((vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)
             in_stack_ffffffffffffe6f0,(size_type)in_stack_ffffffffffffe6e8);
  std::vector<double,_std::allocator<double>_>::resize
            ((vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffe6f0,
             (size_type)in_stack_ffffffffffffe6e8);
  std::vector<double,_std::allocator<double>_>::resize
            ((vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffe6f0,
             (size_type)in_stack_ffffffffffffe6e8);
  std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::resize
            ((vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)
             in_stack_ffffffffffffe6f0,(size_type)in_stack_ffffffffffffe6e8);
  std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::resize
            ((vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)
             in_stack_ffffffffffffe6f0,(size_type)in_stack_ffffffffffffe6e8);
  local_190 = 0;
  for (local_1418 = 0; local_1418 < local_1414; local_1418 = (int)in_RDI[6] + local_1418) {
    DumpReader::readFrame(in_stack_ffffffffffffe760,in_stack_ffffffffffffe75c);
    *(int *)(in_RDI + 0xe2) = (int)in_RDI[0xe2] + 1;
    this_00 = SimInfo::getSnapshotManager((SimInfo *)in_RDI[1]);
    pSVar5 = SnapshotManager::getCurrentSnapshot(this_00);
    in_RDI[0x19] = (long)pSVar5;
    bVar3 = SelectionEvaluator::isDynamic((SelectionEvaluator *)(in_RDI + 0x37));
    if (bVar3) {
      SelectionEvaluator::evaluate(in_stack_ffffffffffffe708);
      SelectionManager::setSelectionSet
                (in_stack_ffffffffffffe6e0,(SelectionSet *)in_stack_ffffffffffffe6d8);
      SelectionSet::~SelectionSet((SelectionSet *)0x13d0fc);
    }
    local_38 = SelectionManager::beginSelected
                         (in_stack_ffffffffffffe6e0,(int *)in_stack_ffffffffffffe6d8);
    while (local_38 != (StuntDouble *)0x0) {
      local_1c = StuntDouble::getGlobalIndex(local_38);
      local_18c = 0;
      for (local_1434 = 0; local_1434 < 0xd; local_1434 = local_1434 + 1) {
        for (local_1438 = -local_1434; local_1438 <= local_1434; local_1438 = local_1438 + 1) {
          local_1440 = std::make_pair<int&,int&>((int *)in_stack_ffffffffffffe6c8,(int *)0x13d231);
          pmVar6 = std::
                   map<std::pair<int,_int>,_std::complex<double>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::complex<double>_>_>_>
                   ::operator[](in_stack_ffffffffffffe710,(key_type *)in_stack_ffffffffffffe708);
          std::complex<double>::operator=(pmVar6,0.0);
        }
      }
      local_10 = SimInfo::beginMolecule
                           (in_stack_ffffffffffffe6f0,(MoleculeIterator *)in_stack_ffffffffffffe6e8)
      ;
      while (local_10 != (Molecule *)0x0) {
        local_18 = Molecule::beginAtom((Molecule *)in_stack_ffffffffffffe6f0,
                                       in_stack_ffffffffffffe6e8);
        while (local_18 != (Atom *)0x0) {
          iVar4 = StuntDouble::getGlobalIndex(&local_18->super_StuntDouble);
          if (iVar4 != local_1c) {
            StuntDouble::getPos(in_stack_ffffffffffffe6d8);
            StuntDouble::getPos(in_stack_ffffffffffffe6d8);
            OpenMD::operator-((Vector<double,_3U> *)in_stack_ffffffffffffe6d8,
                              (Vector<double,_3U> *)in_stack_ffffffffffffe6d0);
            Vector3<double>::operator=
                      ((Vector3<double> *)in_stack_ffffffffffffe6d8,
                       (Vector<double,_3U> *)in_stack_ffffffffffffe6d0);
            if (bVar2) {
              Snapshot::wrapVector(in_stack_ffffffffffffe750,in_stack_ffffffffffffe748);
            }
            in_XMM1_Qa = Vector<double,_3U>::length((Vector<double,_3U> *)0x13d3f1);
            local_68 = in_XMM1_Qa;
            if (in_XMM1_Qa < (double)in_RDI[0xe1]) {
              pdVar7 = Vector3<double>::z(&local_50);
              local_58 = *pdVar7 / local_68;
              pdVar7 = Vector3<double>::y(&local_50);
              dVar12 = *pdVar7;
              pdVar7 = Vector3<double>::x(&local_50);
              in_XMM1_Qa = *pdVar7;
              local_60 = atan2(dVar12,in_XMM1_Qa);
              for (local_148c = 0; local_148c < 0xd; local_148c = local_148c + 1) {
                SphericalHarmonic::setL(&local_1a0,local_148c);
                for (local_1490 = -local_148c; local_1490 <= local_148c; local_1490 = local_1490 + 1
                    ) {
                  SphericalHarmonic::setM(&local_1a0,local_1490);
                  dVar12 = local_60;
                  SphericalHarmonic::getValueAt
                            (in_stack_ffffffffffffe730,in_stack_ffffffffffffe728,
                             (RealType)in_stack_ffffffffffffe720);
                  in_XMM1_Qa = extraout_XMM0_Qa;
                  local_1498 = dVar12;
                  local_14a8 = std::make_pair<int&,int&>
                                         ((int *)in_stack_ffffffffffffe6c8,(int *)0x13d5a5);
                  std::
                  map<std::pair<int,_int>,_std::complex<double>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::complex<double>_>_>_>
                  ::operator[](in_stack_ffffffffffffe710,(key_type *)in_stack_ffffffffffffe708);
                  std::complex<double>::operator+=
                            ((complex<double> *)in_stack_ffffffffffffe6d0,in_stack_ffffffffffffe6c8)
                  ;
                }
              }
              local_18c = local_18c + 1;
            }
          }
          local_18 = Molecule::nextAtom((Molecule *)in_stack_ffffffffffffe6f0,
                                        in_stack_ffffffffffffe6e8);
        }
        local_10 = SimInfo::nextMolecule
                             (in_stack_ffffffffffffe6f0,
                              (MoleculeIterator *)in_stack_ffffffffffffe6e8);
      }
      for (local_14ac = 0; local_14ac < 0xd; local_14ac = local_14ac + 1) {
        pvVar8 = std::vector<double,_std::allocator<double>_>::operator[]
                           (&local_c8,(long)local_14ac);
        *pvVar8 = 0.0;
        for (local_14b0 = -local_14ac; local_14b0 <= local_14ac; local_14b0 = local_14b0 + 1) {
          dVar12 = (double)local_18c;
          local_14b8 = std::make_pair<int&,int&>((int *)in_stack_ffffffffffffe6c8,(int *)0x13d728);
          pmVar6 = std::
                   map<std::pair<int,_int>,_std::complex<double>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::complex<double>_>_>_>
                   ::operator[](in_stack_ffffffffffffe710,(key_type *)in_stack_ffffffffffffe708);
          std::complex<double>::operator/=(pmVar6,dVar12);
          local_14c0 = std::make_pair<int&,int&>((int *)in_stack_ffffffffffffe6c8,(int *)0x13d78e);
          std::
          map<std::pair<int,_int>,_std::complex<double>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::complex<double>_>_>_>
          ::operator[](in_stack_ffffffffffffe710,(key_type *)in_stack_ffffffffffffe708);
          dVar12 = std::norm<double>((complex<double> *)0x13d7d4);
          pvVar8 = std::vector<double,_std::allocator<double>_>::operator[]
                             (&local_c8,(long)local_14ac);
          *pvVar8 = dVar12 + *pvVar8;
        }
        pvVar8 = std::vector<double,_std::allocator<double>_>::operator[]
                           (&local_c8,(long)local_14ac);
        in_XMM1_Qa = (double)(local_14ac * 2 + 1);
        dVar12 = sqrt((*pvVar8 * 4.0 * 3.141592653589793) / in_XMM1_Qa);
        pvVar8 = std::vector<double,_std::allocator<double>_>::operator[](local_b0,(long)local_14ac)
        ;
        *pvVar8 = dVar12;
      }
      for (local_14c4 = 0; local_14c4 < 0xd; local_14c4 = local_14c4 + 1) {
        pvVar9 = std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::
                 operator[](&local_e0,(long)local_14c4);
        std::complex<double>::operator=(pvVar9,0.0);
        for (local_14c8 = -local_14c4; local_14c8 <= local_14c4; local_14c8 = local_14c8 + 1) {
          local_14d0 = std::make_pair<int&,int&>((int *)in_stack_ffffffffffffe6c8,(int *)0x13d916);
          local_14d4 = 0;
          while( true ) {
            iVar1 = local_14d4;
            pmVar10 = std::
                      map<std::pair<int,_int>,_int,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_int>_>_>
                      ::operator[]((map<std::pair<int,_int>,_int,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_int>_>_>
                                    *)in_stack_ffffffffffffe710,
                                   (key_type *)in_stack_ffffffffffffe708);
            iVar4 = *pmVar10;
            pmVar10 = std::
                      map<std::pair<int,_int>,_int,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_int>_>_>
                      ::operator[]((map<std::pair<int,_int>,_int,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_int>_>_>
                                    *)in_stack_ffffffffffffe710,
                                   (key_type *)in_stack_ffffffffffffe708);
            if (iVar4 - *pmVar10 < iVar1) break;
            pmVar10 = std::
                      map<std::pair<int,_int>,_int,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_int>_>_>
                      ::operator[]((map<std::pair<int,_int>,_int,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_int>_>_>
                                    *)in_stack_ffffffffffffe710,
                                   (key_type *)in_stack_ffffffffffffe708);
            local_14d8 = *pmVar10 + local_14d4;
            local_14dc = -(local_14c8 + local_14d8);
            pmVar11 = std::
                      map<std::pair<int,_int>,_std::vector<double,_std::allocator<double>_>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::vector<double,_std::allocator<double>_>_>_>_>
                      ::operator[]((map<std::pair<int,_int>,_std::vector<double,_std::allocator<double>_>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::vector<double,_std::allocator<double>_>_>_>_>
                                    *)in_stack_ffffffffffffe710,
                                   (key_type *)in_stack_ffffffffffffe708);
            std::vector<double,_std::allocator<double>_>::operator[](pmVar11,(long)local_14d4);
            std::
            map<std::pair<int,_int>,_std::complex<double>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::complex<double>_>_>_>
            ::operator[](in_stack_ffffffffffffe710,(key_type *)in_stack_ffffffffffffe708);
            std::operator*((double *)in_stack_ffffffffffffe6c8,(complex<double> *)0x13da96);
            local_1508 = in_XMM1_Qa;
            local_1518 = std::make_pair<int&,int&>((int *)in_stack_ffffffffffffe6c8,(int *)0x13dae3)
            ;
            std::
            map<std::pair<int,_int>,_std::complex<double>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::complex<double>_>_>_>
            ::operator[](in_stack_ffffffffffffe710,(key_type *)in_stack_ffffffffffffe708);
            std::operator*(in_stack_ffffffffffffe6c8,(complex<double> *)0x13db31);
            local_1520 = std::make_pair<int&,int&>((int *)in_stack_ffffffffffffe6c8,(int *)0x13db7e)
            ;
            std::
            map<std::pair<int,_int>,_std::complex<double>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::complex<double>_>_>_>
            ::operator[](in_stack_ffffffffffffe710,(key_type *)in_stack_ffffffffffffe708);
            std::operator*(in_stack_ffffffffffffe6c8,(complex<double> *)0x13dbcc);
            in_XMM1_Qa = extraout_XMM0_Qa_00;
            std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::operator[]
                      (&local_e0,(long)local_14c4);
            std::complex<double>::operator+=
                      ((complex<double> *)in_stack_ffffffffffffe6d0,in_stack_ffffffffffffe6c8);
            local_14d4 = local_14d4 + 1;
          }
        }
        std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::operator[]
                  (&local_e0,(long)local_14c4);
        pvVar8 = std::vector<double,_std::allocator<double>_>::operator[]
                           (&local_c8,(long)local_14c4);
        uVar13 = 0x3ff8000000000000;
        local_1538 = pow(*pvVar8,1.5);
        std::operator/(in_stack_ffffffffffffe6c8,(double *)0x13dcbc);
        in_XMM1_Qa = extraout_XMM0_Qa_01;
        local_1530 = extraout_XMM0_Qa_01;
        local_1528 = uVar13;
        pvVar9 = std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::
                 operator[](&local_f8,(long)local_14c4);
        *(double *)pvVar9->_M_value = local_1530;
        *(undefined8 *)(pvVar9->_M_value + 8) = local_1528;
      }
      std::vector<double,_std::allocator<double>_>::vector
                ((vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffe720,
                 in_stack_ffffffffffffe718);
      std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::vector
                ((vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)
                 in_stack_ffffffffffffe720,
                 (vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)
                 in_stack_ffffffffffffe718);
      (**(code **)(*in_RDI + 0x28))(in_RDI,local_1550,local_1568);
      std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::~vector
                ((vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)
                 in_stack_ffffffffffffe6e0);
      std::vector<double,_std::allocator<double>_>::~vector
                ((vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffe6e0);
      local_190 = local_18c + local_190;
      for (local_156c = 0; local_156c < 0xd; local_156c = local_156c + 1) {
        for (local_1570 = -local_156c; local_1570 <= local_156c; local_1570 = local_1570 + 1) {
          std::make_pair<int&,int&>((int *)in_stack_ffffffffffffe6c8,(int *)0x13de1a);
          std::
          map<std::pair<int,_int>,_std::complex<double>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::complex<double>_>_>_>
          ::operator[](in_stack_ffffffffffffe710,(key_type *)in_stack_ffffffffffffe708);
          std::operator*((double *)in_stack_ffffffffffffe6c8,(complex<double> *)0x13de68);
          in_XMM1_Qa = extraout_XMM0_Qa_02;
          std::make_pair<int&,int&>((int *)in_stack_ffffffffffffe6c8,(int *)0x13deb5);
          std::
          map<std::pair<int,_int>,_std::complex<double>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::complex<double>_>_>_>
          ::operator[](in_stack_ffffffffffffe710,(key_type *)in_stack_ffffffffffffe708);
          std::complex<double>::operator+=
                    ((complex<double> *)in_stack_ffffffffffffe6d0,in_stack_ffffffffffffe6c8);
        }
      }
      local_38 = SelectionManager::nextSelected
                           (in_stack_ffffffffffffe6e0,(int *)in_stack_ffffffffffffe6d8);
    }
  }
  for (local_159c = 0; local_159c < 0xd; local_159c = local_159c + 1) {
    for (local_15a0 = -local_159c; local_15a0 <= local_159c; local_15a0 = local_15a0 + 1) {
      dVar12 = (double)local_190;
      std::make_pair<int&,int&>((int *)in_stack_ffffffffffffe6c8,(int *)0x13e03f);
      pmVar6 = std::
               map<std::pair<int,_int>,_std::complex<double>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::complex<double>_>_>_>
               ::operator[](in_stack_ffffffffffffe710,(key_type *)in_stack_ffffffffffffe708);
      std::complex<double>::operator/=(pmVar6,dVar12);
    }
  }
  for (local_15ac = 0; local_15ac < 0xd; local_15ac = local_15ac + 1) {
    pvVar8 = std::vector<double,_std::allocator<double>_>::operator[](local_140,(long)local_15ac);
    *pvVar8 = 0.0;
    for (local_15b0 = -local_15ac; local_15b0 <= local_15ac; local_15b0 = local_15b0 + 1) {
      std::make_pair<int&,int&>((int *)in_stack_ffffffffffffe6c8,(int *)0x13e12e);
      std::
      map<std::pair<int,_int>,_std::complex<double>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::complex<double>_>_>_>
      ::operator[](in_stack_ffffffffffffe710,(key_type *)in_stack_ffffffffffffe708);
      dVar12 = std::norm<double>((complex<double> *)0x13e174);
      pvVar8 = std::vector<double,_std::allocator<double>_>::operator[](local_140,(long)local_15ac);
      *pvVar8 = dVar12 + *pvVar8;
    }
    pvVar8 = std::vector<double,_std::allocator<double>_>::operator[](local_140,(long)local_15ac);
    dVar12 = sqrt((*pvVar8 * 4.0 * 3.141592653589793) / (double)(local_15ac * 2 + 1));
    pvVar8 = std::vector<double,_std::allocator<double>_>::operator[](&local_158,(long)local_15ac);
    *pvVar8 = dVar12;
  }
  for (local_15bc = 0; local_15bc < 0xd; local_15bc = local_15bc + 1) {
    pvVar9 = std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::operator[]
                       (&local_170,(long)local_15bc);
    std::complex<double>::operator=(pvVar9,0.0);
    for (local_15c0 = -local_15bc; local_15c0 <= local_15bc; local_15c0 = local_15c0 + 1) {
      std::make_pair<int&,int&>((int *)in_stack_ffffffffffffe6c8,(int *)0x13e2b6);
      local_15cc = 0;
      while( true ) {
        pmVar10 = std::
                  map<std::pair<int,_int>,_int,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_int>_>_>
                  ::operator[]((map<std::pair<int,_int>,_int,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_int>_>_>
                                *)in_stack_ffffffffffffe710,(key_type *)in_stack_ffffffffffffe708);
        mVar14 = *pmVar10;
        pmVar10 = std::
                  map<std::pair<int,_int>,_int,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_int>_>_>
                  ::operator[]((map<std::pair<int,_int>,_int,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_int>_>_>
                                *)in_stack_ffffffffffffe710,(key_type *)in_stack_ffffffffffffe708);
        if (mVar14 - *pmVar10 < local_15cc) break;
        std::
        map<std::pair<int,_int>,_int,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_int>_>_>
        ::operator[]((map<std::pair<int,_int>,_int,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_int>_>_>
                      *)in_stack_ffffffffffffe710,(key_type *)in_stack_ffffffffffffe708);
        pmVar11 = std::
                  map<std::pair<int,_int>,_std::vector<double,_std::allocator<double>_>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::vector<double,_std::allocator<double>_>_>_>_>
                  ::operator[]((map<std::pair<int,_int>,_std::vector<double,_std::allocator<double>_>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::vector<double,_std::allocator<double>_>_>_>_>
                                *)in_stack_ffffffffffffe710,(key_type *)in_stack_ffffffffffffe708);
        std::vector<double,_std::allocator<double>_>::operator[](pmVar11,(long)local_15cc);
        std::
        map<std::pair<int,_int>,_std::complex<double>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::complex<double>_>_>_>
        ::operator[](in_stack_ffffffffffffe710,(key_type *)in_stack_ffffffffffffe708);
        std::operator*((double *)in_stack_ffffffffffffe6c8,(complex<double> *)0x13e42a);
        __k = extraout_XMM0_Qa_03;
        in_stack_ffffffffffffe720 =
             std::make_pair<int&,int&>((int *)in_stack_ffffffffffffe6c8,(int *)0x13e46b);
        in_stack_ffffffffffffe718 =
             (vector<double,_std::allocator<double>_> *)
             std::
             map<std::pair<int,_int>,_std::complex<double>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::complex<double>_>_>_>
             ::operator[](in_stack_ffffffffffffe710,(key_type *)in_stack_ffffffffffffe708);
        std::operator*(in_stack_ffffffffffffe6c8,(complex<double> *)0x13e4ad);
        in_stack_ffffffffffffe710 = extraout_XMM0_Qa_04;
        std::make_pair<int&,int&>((int *)in_stack_ffffffffffffe6c8,(int *)0x13e4ee);
        std::
        map<std::pair<int,_int>,_std::complex<double>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::complex<double>_>_>_>
        ::operator[](in_stack_ffffffffffffe710,(key_type *)__k);
        std::operator*(in_stack_ffffffffffffe6c8,(complex<double> *)0x13e530);
        std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::operator[]
                  (&local_170,(long)local_15bc);
        std::complex<double>::operator+=
                  ((complex<double> *)in_stack_ffffffffffffe6d0,in_stack_ffffffffffffe6c8);
        local_15cc = local_15cc + 1;
        in_stack_ffffffffffffe708 = __k;
      }
    }
    in_stack_ffffffffffffe6d0 =
         (DumpReader *)
         std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::operator[]
                   (&local_170,(long)local_15bc);
    pvVar8 = std::vector<double,_std::allocator<double>_>::operator[](local_140,(long)local_15bc);
    uVar13 = 0x3ff8000000000000;
    pow(*pvVar8,1.5);
    std::operator/(in_stack_ffffffffffffe6c8,(double *)0x13e60e);
    in_stack_ffffffffffffe6e0 = extraout_XMM0_Qa_05;
    pvVar9 = std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::operator[]
                       (&local_188,(long)local_15bc);
    *(SelectionManager **)pvVar9->_M_value = extraout_XMM0_Qa_05;
    *(undefined8 *)(pvVar9->_M_value + 8) = uVar13;
  }
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffe720,
             in_stack_ffffffffffffe718);
  std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::vector
            ((vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)
             in_stack_ffffffffffffe720,
             (vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)
             in_stack_ffffffffffffe718);
  writeOrderParameter(in_stack_ffffffffffffedf0,in_stack_ffffffffffffede8,in_stack_ffffffffffffede0)
  ;
  std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::~vector
            ((vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)
             in_stack_ffffffffffffe6e0);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffe6e0);
  DumpReader::~DumpReader(in_stack_ffffffffffffe6d0);
  SphericalHarmonic::~SphericalHarmonic(&local_1a0);
  std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::~vector
            ((vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)
             in_stack_ffffffffffffe6e0);
  std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::~vector
            ((vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)
             in_stack_ffffffffffffe6e0);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffe6e0);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffe6e0);
  std::
  map<std::pair<int,_int>,_std::complex<double>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::complex<double>_>_>_>
  ::~map((map<std::pair<int,_int>,_std::complex<double>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::complex<double>_>_>_>
          *)0x13e73e);
  std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::~vector
            ((vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)
             in_stack_ffffffffffffe6e0);
  std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::~vector
            ((vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)
             in_stack_ffffffffffffe6e0);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffe6e0);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffe6e0);
  std::
  map<std::pair<int,_int>,_std::complex<double>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::complex<double>_>_>_>
  ::~map((map<std::pair<int,_int>,_std::complex<double>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::complex<double>_>_>_>
          *)0x13e77f);
  return;
}

Assistant:

void BondOrderParameter::process() {
    Molecule* mol;
    Atom* atom;
    int myIndex;
    SimInfo::MoleculeIterator mi;
    Molecule::AtomIterator ai;
    StuntDouble* sd;
    Vector3d vec;
    RealType costheta;
    RealType phi;
    RealType r;
    std::map<std::pair<int, int>, ComplexType> q;
    std::vector<RealType> q_l;
    std::vector<RealType> q2;
    std::vector<ComplexType> w;
    std::vector<ComplexType> w_hat;
    std::map<std::pair<int, int>, ComplexType> QBar;
    std::vector<RealType> Q2;
    std::vector<RealType> Q;
    std::vector<ComplexType> W;
    std::vector<ComplexType> W_hat;
    int nBonds, Nbonds;
    SphericalHarmonic sphericalHarmonic;
    int i;
    bool usePeriodicBoundaryConditions_ =
        info_->getSimParams()->getUsePeriodicBoundaryConditions();

    DumpReader reader(info_, dumpFilename_);
    int nFrames   = reader.getNFrames();
    frameCounter_ = 0;

    q_l.resize(lMax_ + 1);
    q2.resize(lMax_ + 1);
    w.resize(lMax_ + 1);
    w_hat.resize(lMax_ + 1);

    Q2.resize(lMax_ + 1);
    Q.resize(lMax_ + 1);
    W.resize(lMax_ + 1);
    W_hat.resize(lMax_ + 1);
    Nbonds = 0;

    for (int istep = 0; istep < nFrames; istep += step_) {
      reader.readFrame(istep);
      frameCounter_++;
      currentSnapshot_ = info_->getSnapshotManager()->getCurrentSnapshot();

      if (evaluator_.isDynamic()) {
        seleMan_.setSelectionSet(evaluator_.evaluate());
      }

      // outer loop is over the selected StuntDoubles:

      for (sd = seleMan_.beginSelected(i); sd != NULL;
           sd = seleMan_.nextSelected(i)) {
        myIndex = sd->getGlobalIndex();
        nBonds  = 0;

        for (int l = 0; l <= lMax_; l++) {
          for (int m = -l; m <= l; m++) {
            q[std::make_pair(l, m)] = 0.0;
          }
        }

        // inner loop is over all other atoms in the system:

        for (mol = info_->beginMolecule(mi); mol != NULL;
             mol = info_->nextMolecule(mi)) {
          for (atom = mol->beginAtom(ai); atom != NULL;
               atom = mol->nextAtom(ai)) {
            if (atom->getGlobalIndex() != myIndex) {
              vec = sd->getPos() - atom->getPos();

              if (usePeriodicBoundaryConditions_)
                currentSnapshot_->wrapVector(vec);

              // Calculate "bonds" and build Q_lm(r) where
              //      Q_lm = Y_lm(theta(r),phi(r))
              // The spherical harmonics are wrt any arbitrary coordinate
              // system, we choose standard spherical coordinates

              r = vec.length();

              // Check to see if neighbor is in bond cutoff

              if (r < rCut_) {
                costheta = vec.z() / r;
                phi      = atan2(vec.y(), vec.x());

                for (int l = 0; l <= lMax_; l++) {
                  sphericalHarmonic.setL(l);
                  for (int m = -l; m <= l; m++) {
                    sphericalHarmonic.setM(m);
                    q[std::make_pair(l, m)] +=
                        sphericalHarmonic.getValueAt(costheta, phi);
                  }
                }
                nBonds++;
              }
            }
          }
        }

        for (int l = 0; l <= lMax_; l++) {
          q2[l] = 0.0;
          for (int m = -l; m <= l; m++) {
            q[std::make_pair(l, m)] /= (RealType)nBonds;

            q2[l] += norm(q[std::make_pair(l, m)]);
          }
          q_l[l] = sqrt(q2[l] * 4.0 * Constants::PI / (RealType)(2 * l + 1));
        }

        // Find Third Order Invariant W_l

        for (int l = 0; l <= lMax_; l++) {
          w[l] = 0.0;
          for (int m1 = -l; m1 <= l; m1++) {
            std::pair<int, int> lm = std::make_pair(l, m1);
            for (int mmm = 0; mmm <= (m2Max[lm] - m2Min[lm]); mmm++) {
              int m2 = m2Min[lm] + mmm;
              int m3 = -m1 - m2;
              w[l] += w3j[lm][mmm] * q[lm] * q[std::make_pair(l, m2)] *
                      q[std::make_pair(l, m3)];
            }
          }

          w_hat[l] = w[l] / pow(q2[l], RealType(1.5));
        }

        collectHistogram(q_l, w_hat);

        Nbonds += nBonds;
        for (int l = 0; l <= lMax_; l++) {
          for (int m = -l; m <= l; m++) {
            QBar[std::make_pair(l, m)] +=
                (RealType)nBonds * q[std::make_pair(l, m)];
          }
        }
      }
    }

    // Normalize Qbar2
    for (int l = 0; l <= lMax_; l++) {
      for (int m = -l; m <= l; m++) {
        QBar[std::make_pair(l, m)] /= Nbonds;
      }
    }

    // Find second order invariant Q_l

    for (int l = 0; l <= lMax_; l++) {
      Q2[l] = 0.0;
      for (int m = -l; m <= l; m++) {
        Q2[l] += norm(QBar[std::make_pair(l, m)]);
      }
      Q[l] = sqrt(Q2[l] * 4.0 * Constants::PI / (RealType)(2 * l + 1));
    }

    // Find Third Order Invariant W_l

    for (int l = 0; l <= lMax_; l++) {
      W[l] = 0.0;
      for (int m1 = -l; m1 <= l; m1++) {
        std::pair<int, int> lm = std::make_pair(l, m1);
        for (int mmm = 0; mmm <= (m2Max[lm] - m2Min[lm]); mmm++) {
          int m2 = m2Min[lm] + mmm;
          int m3 = -m1 - m2;
          W[l] += w3j[lm][mmm] * QBar[lm] * QBar[std::make_pair(l, m2)] *
                  QBar[std::make_pair(l, m3)];
        }
      }

      W_hat[l] = W[l] / pow(Q2[l], RealType(1.5));
    }

    writeOrderParameter(Q, W_hat);
  }